

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupPupdate(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *x;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar1;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  
  pUVar1 = this->theCoPvec;
  this_00 = &this->thePvec->thedelta;
  x = &pUVar1->thedelta;
  if ((pUVar1->thedelta).setupStatus == true) {
    if ((double)((int)((ulong)((long)(pUVar1->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pUVar1->
                                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333)
        * 0.95 <= (double)(pUVar1->thedelta).super_IdxSet.num) {
      (*this->multTimeColwise->_vptr_Timer[3])();
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::
      assign2product<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)this_00,x,this->thevectors);
      (*this->multTimeColwise->_vptr_Timer[4])();
      this->multColwiseCalls = this->multColwiseCalls + 1;
    }
    else {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::
      assign2product4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)this_00,this->thecovectors,x,this->multTimeSparse,this->multTimeFull,
                 &this->multSparseCalls,&this->multFullCalls);
    }
  }
  else {
    (*this->multTimeUnsetup->_vptr_Timer[3])();
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    assign2productAndSetup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)this_00,this->thecovectors,x);
    (*this->multTimeUnsetup->_vptr_Timer[4])();
    this->multUnsetupCalls = this->multUnsetupCalls + 1;
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(this_00);
  return;
}

Assistant:

void SPxSolverBase<R>::setupPupdate(void)
{
   SSVectorBase<R>& p = thePvec->delta();
   SSVectorBase<R>& c = theCoPvec->delta();

   if(c.isSetup())
   {
      if(c.size() < 0.95 * theCoPvec->dim())
         p.assign2product4setup(*thecovectors, c,
                                multTimeSparse, multTimeFull,
                                multSparseCalls, multFullCalls);
      else
      {
         multTimeColwise->start();
         p.assign2product(c, *thevectors);
         multTimeColwise->stop();
         ++multColwiseCalls;
      }
   }
   else
   {
      multTimeUnsetup->start();
      p.assign2productAndSetup(*thecovectors, c);
      multTimeUnsetup->stop();
      ++multUnsetupCalls;
   }

   p.setup();
}